

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrVirtualKeyboardModelAnimationStatesMETA *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  string type_prefix;
  string states_prefix;
  string statecountoutput_prefix;
  string statecapacityinput_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  ostringstream oss_stateCapacityInput;
  ostringstream oss_states;
  uint auStack_308 [88];
  ostringstream oss_stateCountOutput;
  
  PointerToHexString<XrVirtualKeyboardModelAnimationStatesMETA>
            ((XrVirtualKeyboardModelAnimationStatesMETA *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_stateCapacityInput);
  std::__cxx11::string::~string((string *)&oss_stateCapacityInput);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_stateCapacityInput,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_stateCapacityInput);
    std::__cxx11::string::~string((string *)&oss_stateCapacityInput);
  }
  else {
    _oss_stateCapacityInput = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_stateCapacityInput);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_stateCapacityInput);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_4b8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4b8,contents);
  std::__cxx11::string::~string((string *)&local_4b8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&statecapacityinput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&statecapacityinput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_stateCapacityInput);
    poVar4 = std::operator<<((ostream *)&oss_stateCapacityInput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&statecapacityinput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_stateCountOutput);
    std::__cxx11::string::~string((string *)&oss_stateCountOutput);
    std::__cxx11::string::string((string *)&statecountoutput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&statecountoutput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_stateCountOutput);
    poVar4 = std::operator<<((ostream *)&oss_stateCountOutput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&statecountoutput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_states);
    std::__cxx11::string::~string((string *)&oss_states);
    std::__cxx11::string::string((string *)&states_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&states_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_states);
    *(uint *)((long)auStack_308 + *(long *)(_oss_states + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_states + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_states);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [37])0x216740,&states_prefix,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_states);
    std::__cxx11::string::~string((string *)&states_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_stateCountOutput);
    std::__cxx11::string::~string((string *)&statecountoutput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_stateCapacityInput);
    std::__cxx11::string::~string((string *)&statecapacityinput_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrVirtualKeyboardModelAnimationStatesMETA* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string statecapacityinput_prefix = prefix;
        statecapacityinput_prefix += "stateCapacityInput";
        std::ostringstream oss_stateCapacityInput;
        oss_stateCapacityInput << "0x" << std::hex << (value->stateCapacityInput);
        contents.emplace_back("uint32_t", statecapacityinput_prefix, oss_stateCapacityInput.str());
        std::string statecountoutput_prefix = prefix;
        statecountoutput_prefix += "stateCountOutput";
        std::ostringstream oss_stateCountOutput;
        oss_stateCountOutput << "0x" << std::hex << (value->stateCountOutput);
        contents.emplace_back("uint32_t", statecountoutput_prefix, oss_stateCountOutput.str());
        std::string states_prefix = prefix;
        states_prefix += "states";
        std::ostringstream oss_states;
        oss_states << std::hex << reinterpret_cast<const void*>(value->states);
        contents.emplace_back("XrVirtualKeyboardAnimationStateMETA*", states_prefix, oss_states.str());
        return true;
    } catch(...) {
    }
    return false;
}